

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_dlba_encoder.hpp
# Opt level: O0

void __thiscall
duckdb::DlbaEncoder::WriteValue<duckdb::string_t>
          (DlbaEncoder *this,WriteStream *writer,string_t *value)

{
  idx_t iVar1;
  pointer pMVar2;
  char *src;
  const_data_ptr_t pdVar3;
  string_t *in_RDX;
  DbpEncoder *in_RSI;
  WriteStream *in_stack_ffffffffffffffb8;
  
  iVar1 = string_t::GetSize(in_RDX);
  UnsafeNumericCast<long,unsigned_long,void>(iVar1);
  DbpEncoder::WriteValue<long>(in_RSI,in_stack_ffffffffffffffb8,(int64_t *)0x5c0e22);
  pMVar2 = unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_false>::
           operator->((unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_false>
                       *)in_RSI);
  src = string_t::GetData((string_t *)in_RSI);
  pdVar3 = const_data_ptr_cast<char>(src);
  iVar1 = string_t::GetSize(in_RDX);
  (*(code *)**(undefined8 **)pMVar2)(pMVar2,pdVar3,iVar1);
  return;
}

Assistant:

inline void DlbaEncoder::WriteValue(WriteStream &writer, const string_t &value) {
	dbp_encoder.WriteValue(writer, UnsafeNumericCast<int64_t>(value.GetSize()));
	stream->WriteData(const_data_ptr_cast(value.GetData()), value.GetSize());
}